

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

void * __thiscall camp::UserObject::pointer(UserObject *this)

{
  element_type *peVar1;
  UserProperty *this_00;
  int iVar2;
  undefined4 extraout_var;
  ParentObject *pPVar3;
  void *pvVar4;
  scoped_ptr<camp::ParentObject> *this_01;
  UserObject UStack_78;
  Value local_50;
  
  peVar1 = (this->m_holder).
           super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_AbstractObjectHolder[2])();
    return (void *)CONCAT44(extraout_var,iVar2);
  }
  if ((this->m_parent).px == (ParentObject *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    this_01 = &this->m_parent;
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(this_01);
    this_00 = pPVar3->member;
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(this_01);
    Property::get(&local_50,&this_00->super_Property,&pPVar3->object);
    Value::to<camp::UserObject>(&UStack_78,&local_50);
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(this_01);
    operator=(&pPVar3->lastValue,&UStack_78);
    ~UserObject(&UStack_78);
    boost::
    variant<camp::NoType,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_camp::EnumObject,_camp::UserObject>
    ::destroy_content(&local_50.m_value);
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(this_01);
    pvVar4 = pointer(&pPVar3->lastValue);
  }
  return pvVar4;
}

Assistant:

void* UserObject::pointer() const
{
    if (m_holder)
    {
        return m_holder->object();
    }
    else if (m_parent)
    {
        // warning: this may not be multi-thread safe,
        // but it is required to make the returned value persistent
        m_parent->lastValue = m_parent->member.get(m_parent->object).to<UserObject>();
        return m_parent->lastValue.pointer();
    }
    else
    {
        return 0;
    }
}